

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O2

bool __thiscall Item::operator<(Item *this,Item *o)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  runtime_error *this_00;
  ulong uVar5;
  bool bVar6;
  bool bVar7;
  char _error_msg_ [256];
  
  uVar1 = this->ndims;
  if (uVar1 != o->ndims) {
    snprintf(_error_msg_,0x100,"AssertionError: assertion `%s` failed in \"%s\" line %d",
             "ndims == o.ndims",
             "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/instance.cpp"
             ,0x11);
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,_error_msg_);
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  iVar2 = o->key;
  iVar3 = this->key;
  bVar7 = SBORROW4(iVar3,iVar2);
  bVar6 = iVar3 - iVar2 < 0;
  if (iVar3 == iVar2) {
    uVar5 = 0;
    uVar4 = (ulong)uVar1;
    if ((int)uVar1 < 1) {
      uVar4 = uVar5;
    }
    do {
      if (uVar4 == uVar5) {
        bVar7 = SBORROW4(this->demand,o->demand);
        bVar6 = this->demand - o->demand < 0;
        break;
      }
      iVar2 = (o->w).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_start[uVar5];
      iVar3 = (this->w).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[uVar5];
      bVar7 = SBORROW4(iVar3,iVar2);
      bVar6 = iVar3 - iVar2 < 0;
      uVar5 = uVar5 + 1;
    } while (iVar3 == iVar2);
  }
  return bVar7 != bVar6;
}

Assistant:

bool Item::operator<(const Item &o) const {
	throw_assert(ndims == o.ndims);
	if (abs(key - o.key) >= 1e-5) {
		return key < o.key;
	}
	for (int i = 0; i < ndims; i++) {
		if (w[i] != o.w[i]) {
			return w[i] < o.w[i];
		}
	}
	return demand < o.demand;
}